

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void winPath(string *path)

{
  uint uVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (uint)path->_M_string_length;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = (path->_M_dataplus)._M_p;
    if (pcVar2[uVar4] == '/') {
      pcVar2[uVar4] = '\\';
    }
  }
  return;
}

Assistant:

void winPath( string& path )
{
	for (int i = 0, size = path.size(); i < size; i++)
	{
		if (path[i] == '/')
			path[i] = '\\';
	}
}